

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::
         LegacyGeneratedClassName<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc)

{
  long lVar1;
  string *psVar2;
  long *plVar3;
  size_type *psVar4;
  long lVar5;
  string classname;
  __string_type __str;
  string local_a0;
  string local_80;
  string *local_60;
  Descriptor *local_58;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  lVar5 = **(long **)(desc + 8);
  local_60 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,lVar5,(*(long **)(desc + 8))[1] + lVar5);
  lVar5 = *(long *)(desc + 0x18);
  local_58 = desc;
  if (lVar5 != 0) {
    do {
      lVar1 = **(long **)(lVar5 + 8);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar1,(*(long **)(lVar5 + 8))[1] + lVar1);
      std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,(ulong)local_a0._M_dataplus._M_p);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80.field_2._8_8_ = plVar3[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_80._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      lVar5 = *(long *)(lVar5 + 0x18);
    } while (lVar5 != 0);
  }
  ClassNamePrefix<google::protobuf::Descriptor>(&local_80,&local_a0,local_58);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
  psVar2 = local_60;
  (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar5 = plVar3[3];
    (local_60->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&local_60->field_2 + 8) = lVar5;
  }
  else {
    (local_60->_M_dataplus)._M_p = (pointer)*plVar3;
    (local_60->field_2)._M_allocated_capacity = *psVar4;
  }
  local_60->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return psVar2;
}

Assistant:

std::string LegacyGeneratedClassName(const DescriptorType* desc) {
  std::string classname = desc->name();
  const Descriptor* containing = desc->containing_type();
  while (containing != NULL) {
    classname = containing->name() + '_' + classname;
    containing = containing->containing_type();
  }
  return ClassNamePrefix(classname, desc) + classname;
}